

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

UINT16 UINT16_Marshal(UINT16 *source,BYTE **buffer,INT32 *size)

{
  int iVar1;
  
  if ((buffer != (BYTE **)0x0) &&
     ((size == (INT32 *)0x0 || (iVar1 = *size, *size = iVar1 + -2, 1 < iVar1)))) {
    Uint16ToByteArray(*source,*buffer);
    *buffer = *buffer + 2;
  }
  return 2;
}

Assistant:

UINT16 UINT16_Marshal(UINT16 *source, BYTE **buffer, INT32 *size)
{
    if (buffer != 0)
    {
        if ((size == 0) || ((*size -= 2) >= 0))
        {
            UINT16_TO_BYTE_ARRAY(*source, *buffer);
            *buffer += 2;
        }
        //pAssert(size == 0 || (*size >= 0));
    }
    return (2);
}